

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdleDecommitPageAllocator.cpp
# Opt level: O0

DWORD __thiscall Memory::IdleDecommitPageAllocator::IdleDecommit(IdleDecommitPageAllocator *this)

{
  code *pcVar1;
  bool bVar2;
  DWORD DVar3;
  DWORD DVar4;
  ThreadContextId pvVar5;
  undefined8 *in_FS_OFFSET;
  DWORD local_20;
  int timediff;
  DWORD waitTime;
  DWORD waitTime_1;
  IdleDecommitPageAllocator *this_local;
  
  if ((this->hasDecommitTimer & 1U) == 0) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    bVar2 = CCLock::TryEnter(&(this->cs).super_CCLock);
    if (bVar2) {
      this->idleDecommitTryEnterWaitFactor = 0;
      local_20 = 0xffffffff;
      DVar3 = local_20;
      if ((this->hasDecommitTimer & 1U) != 0) {
        if ((this->super_PageAllocator).maxFreePageCount != this->maxIdleDecommitFreePageCount) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                             ,0xfc,"(this->maxFreePageCount == maxIdleDecommitFreePageCount)",
                             "this->maxFreePageCount == maxIdleDecommitFreePageCount");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        DVar3 = this->decommitTime;
        DVar4 = GetTickCount();
        DVar3 = DVar3 - DVar4;
        if ((int)DVar3 < 0x14) {
          bVar2 = Js::Phases::IsEnabled
                            (&((this->super_PageAllocator).pageAllocatorFlagTable)->Trace,
                             PageAllocatorPhase);
          if (bVar2) {
            pvVar5 = GetCurrentThreadContextId();
            DVar3 = GetCurrentThreadId();
            Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar5,(ulong)DVar3,this);
            if ((this->super_PageAllocator).debugName != (char16 *)0x0) {
              Output::Print(L"[%s] ",(this->super_PageAllocator).debugName);
            }
            Output::Print(L"IdleDecommit");
            Output::Print(L"\n");
            Output::Flush();
          }
          this->idleDecommitCount = this->idleDecommitCount + 1;
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::DecommitNow(&this->super_PageAllocator,true);
          this->hasDecommitTimer = false;
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::ClearMinFreePageCount(&this->super_PageAllocator);
          (this->super_PageAllocator).maxFreePageCount = this->maxNonIdleDecommitFreePageCount;
          DVar3 = local_20;
        }
      }
      local_20 = DVar3;
      CCLock::Leave(&(this->cs).super_CCLock);
      this_local._4_4_ = local_20;
    }
    else {
      bVar2 = Js::Phases::IsEnabled
                        (&((this->super_PageAllocator).pageAllocatorFlagTable)->Trace,
                         PageAllocatorPhase);
      if (bVar2) {
        pvVar5 = GetCurrentThreadContextId();
        DVar3 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar5,(ulong)DVar3,this);
        if ((this->super_PageAllocator).debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ",(this->super_PageAllocator).debugName);
        }
        Output::Print(L"IdleDecommit Retry");
        Output::Print(L"\n");
        Output::Flush();
      }
      this->idleDecommitTryEnterWaitFactor = this->idleDecommitTryEnterWaitFactor + 1;
      if (9 < this->idleDecommitTryEnterWaitFactor) {
        this->idleDecommitTryEnterWaitFactor = 1;
      }
      this_local._4_4_ = this->idleDecommitTryEnterWaitFactor * 0xb;
    }
  }
  return this_local._4_4_;
}

Assistant:

DWORD
IdleDecommitPageAllocator::IdleDecommit()
{
    // We can check hasDecommitTimer outside of the lock because when it change to true
    // the Recycler::concurrentIdleDecommitEvent will signal and we try to IdleDecommit again
    // If it change to false, we check again when we acquired the lock
    if (!hasDecommitTimer)
    {
        return INFINITE;
    }
    if (!cs.TryEnter())
    {
        // Failed to acquire the lock, wait for a variable time.
        PAGE_ALLOC_TRACE(_u("IdleDecommit Retry"));

        // Varies the wait time between 11 - 99
        idleDecommitTryEnterWaitFactor++;
        if (idleDecommitTryEnterWaitFactor >= 10)
        {
            idleDecommitTryEnterWaitFactor = 1;
        }
        DWORD waitTime = 11 * idleDecommitTryEnterWaitFactor;
        return waitTime;      // Retry time
    }
    idleDecommitTryEnterWaitFactor = 0;
    DWORD waitTime = INFINITE;
    if (hasDecommitTimer)
    {
        Assert(this->maxFreePageCount == maxIdleDecommitFreePageCount);
        int timediff = (int)(decommitTime - ::GetTickCount());
        if (timediff >= 20)   // Ignore time diff is it is < 20 since the system timer doesn't have that high of precision anyways
        {
            waitTime = (DWORD)timediff;
        }
        else
        {
            // Do the decommit in normal priority so that we don't block the main thread for too long
            PAGE_ALLOC_TRACE(_u("IdleDecommit"));
#if DBG_DUMP
            idleDecommitCount++;
#endif
            __super::DecommitNow();
            hasDecommitTimer = false;
            ClearMinFreePageCount();
            this->maxFreePageCount = maxNonIdleDecommitFreePageCount;
        }
    }
    cs.Leave();
    return waitTime;
}